

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowValueLocalState::Finalize
          (WindowValueLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection)

{
  WindowValueGlobalState *pWVar1;
  _Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_> __ptr;
  optional_ptr<duckdb::WindowCollection,_true> paged;
  WindowMergeSortTreeLocalState *this_00;
  _Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_> this_01;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_02;
  pointer __p;
  WindowCursor *local_30;
  optional_ptr<duckdb::WindowCollection,_true> local_28;
  
  local_28.ptr = collection.ptr;
  WindowExecutorLocalState::Finalize((WindowExecutorLocalState *)this,gstate,collection);
  if ((this->local_value).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    this_00 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_value);
    WindowMergeSortTreeLocalState::Sort(this_00);
    WindowMergeSortTree::Build
              ((WindowMergeSortTree *)
               this_00[1].super_WindowAggregatorState._vptr_WindowAggregatorState);
  }
  if (((this->cursor).
       super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
       super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
       super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0) &&
     (this->gvstate->child_idx != 0xffffffffffffffff)) {
    optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_28);
    paged.ptr = local_28.ptr;
    pWVar1 = this->gvstate;
    this_01.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::WindowCursor_*,_false>)operator_new(200);
    WindowCursor::WindowCursor
              ((WindowCursor *)
               this_01.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl,paged.ptr,
               pWVar1->child_idx);
    this_02 = &this->cursor;
    local_30 = (WindowCursor *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (this_02->
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>;
    (this_02->super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>).
    _M_t.super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl !=
        (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)this_02,
                 (WindowCursor *)
                 __ptr.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl);
    }
    if (local_30 != (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&local_30,local_30);
    }
  }
  return;
}

Assistant:

void WindowValueLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	WindowExecutorBoundsState::Finalize(gstate, collection);

	if (local_value) {
		auto &value_state = local_value->Cast<WindowIndexTreeLocalState>();
		value_state.Sort();
		value_state.index_tree.Build();
	}

	// Prepare to scan
	if (!cursor && gvstate.child_idx != DConstants::INVALID_INDEX) {
		cursor = make_uniq<WindowCursor>(*collection, gvstate.child_idx);
	}
}